

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_time.cc
# Opt level: O0

void __thiscall CSocekt::DeleteFromTimerQueue(CSocekt *this,lp_connection_t pConn)

{
  bool bVar1;
  CMemory *pCVar2;
  pointer ppVar3;
  _Base_ptr p_Var4;
  lp_connection_t in_RSI;
  iterator in_RDI;
  MutexLockGuard lock;
  CMemory *p_memory;
  iterator posend;
  iterator pos;
  iterator in_stack_ffffffffffffff88;
  CMemory *in_stack_ffffffffffffff90;
  iterator in_stack_ffffffffffffffa0;
  _Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_> local_20;
  _Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_> local_18;
  lp_connection_t local_10;
  
  local_10 = in_RSI;
  std::_Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>::_Rb_tree_iterator(&local_18);
  std::_Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>::_Rb_tree_iterator(&local_20);
  pCVar2 = CMemory::GetInstance();
  muduo::MutexLockGuard::MutexLockGuard
            ((MutexLockGuard *)in_stack_ffffffffffffff90,
             (MutexLock *)in_stack_ffffffffffffff88._M_node);
  do {
    local_18._M_node =
         (_Base_ptr)
         std::
         multimap<long,__STRUC_MSG_HEADER_*,_std::less<long>,_std::allocator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>_>
         ::begin(in_stack_ffffffffffffff88._M_node);
    local_20._M_node =
         (_Base_ptr)
         std::
         multimap<long,__STRUC_MSG_HEADER_*,_std::less<long>,_std::allocator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>_>
         ::end(in_stack_ffffffffffffff88._M_node);
    while( true ) {
      bVar1 = std::operator!=(&local_18,&local_20);
      if (!bVar1) {
        if (in_RDI._M_node[0xd3]._M_parent != (_Base_ptr)0x0) {
          p_Var4 = (_Base_ptr)GetEarliestTime((CSocekt *)in_stack_ffffffffffffffa0._M_node);
          in_RDI._M_node[0xd3]._M_left = p_Var4;
        }
        muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x14360c);
        return;
      }
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_> *)0x14352e
                         );
      if (ppVar3->second->pConn == local_10) break;
      std::_Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_> *)
                 in_stack_ffffffffffffff90);
    }
    in_stack_ffffffffffffff90 = pCVar2;
    std::_Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_> *)0x143554);
    CMemory::FreeMemory(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88._M_node);
    in_stack_ffffffffffffff88 =
         std::
         multimap<long,_STRUC_MSG_HEADER*,std::less<long>,std::allocator<std::pair<long_const,_STRUC_MSG_HEADER*>>>
         ::erase_abi_cxx11_((multimap<long,__STRUC_MSG_HEADER_*,_std::less<long>,_std::allocator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>_>
                             *)in_stack_ffffffffffffff90,in_RDI);
    in_RDI._M_node[0xd3]._M_parent =
         (_Base_ptr)((long)&in_RDI._M_node[0xd3]._M_parent[-1]._M_right + 7);
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff88;
  } while( true );
}

Assistant:

void CSocekt::DeleteFromTimerQueue(lp_connection_t pConn)
{
    std::multimap<time_t, LPSTRUC_MSG_HEADER>::iterator pos,posend;
	CMemory *p_memory = CMemory::GetInstance();

    muduo::MutexLockGuard lock(m_timequeueMutex);

    //因为实际情况可能比较复杂，将来可能还扩充代码等等，所以如下我们遍历整个队列找 一圈，而不是找到一次就拉倒，以免出现什么遗漏
lblMTQM:
	pos    = m_timerQueuemap.begin();
	posend = m_timerQueuemap.end();
	for(; pos != posend; ++pos)	
	{
		if(pos->second->pConn == pConn)
		{			
			p_memory->FreeMemory(pos->second);  //释放内存
			m_timerQueuemap.erase(pos);
			--m_cur_size_; //减去一个元素，必然要把尺寸减少1个;								
			goto lblMTQM;
		}		
	}
	if(m_cur_size_ > 0)
	{
		m_timer_value_ = GetEarliestTime();
	}
    return;    
}